

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O3

ErrorCode __thiscall ComponentManager::RemoveService(ComponentManager *this,CID cid)

{
  Node *pNVar1;
  ClassInfo *pCVar2;
  int iVar3;
  ClassInfo *info;
  Node *pNVar4;
  iterator ret;
  iterator local_28;
  
  pNVar4 = (this->mClasses).mHead;
  pNVar1 = (this->mClasses).mTail;
  do {
    pNVar4 = pNVar4->next;
    if (pNVar4 == pNVar1) {
      return kNoClass;
    }
    pCVar2 = pNVar4->val;
    iVar3 = strcmp((pCVar2->mCid).mId,cid.mId);
  } while (iVar3 != 0);
  (*pCVar2->mClass->_vptr_ISupports[1])();
  operator_delete(pCVar2,0x10);
  JetHead::list<ComponentManager::ClassInfo_*>::iterator::erase(&local_28);
  return kNoError;
}

Assistant:

ErrorCode ComponentManager::RemoveService( CID cid )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	ClassInfo match( cid );

	for (JetHead::list<ClassInfo*>::iterator i = mClasses.begin(); 
		 i != mClasses.end(); ++i)
	{
		if (*(*i) == match)
		{
			ClassInfo *info = *i;
			info->mClass->Release();
			delete info;
			i.erase();
			return kNoError;
		}
	}
	
	return kNoClass;	
}